

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions(EnvironmentNAVXYTHETALATTICE *this)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  pointer psVar4;
  pointer psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  sbpl_xy_theta_pt_t pose;
  sbpl_xy_theta_pt_t pose_00;
  sbpl_xy_theta_pt_t pose_01;
  char cVar10;
  ulong uVar11;
  EnvNAVXYTHETALATAction_t **ppEVar12;
  ulong *puVar13;
  ulong uVar14;
  EnvNAVXYTHETALATAction_t *pEVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  char cVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar23;
  undefined4 uVar24;
  EnvNAVXYTHETALATAction_t *local_190;
  double local_188;
  undefined8 uStack_180;
  ulong local_170;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  long local_148;
  EnvironmentNAVXYTHETALATTICE *local_140;
  long local_138;
  double local_130;
  double dStack_128;
  undefined8 local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double local_100;
  double dStack_f8;
  undefined8 local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_d0;
  double dStack_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  _Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_78;
  _Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_60;
  _Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_48;
  
  iVar16 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  uVar21 = (ulong)iVar16;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar21;
  uVar11 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar22 = 0xffffffffffffffff;
  uVar14 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar14 = uVar22;
  }
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar14 = uVar22;
  }
  uVar18 = uVar21 * 8;
  if (iVar16 < 0) {
    uVar18 = uVar22;
  }
  ppEVar12 = (EnvNAVXYTHETALATAction_t **)operator_new__(uVar18);
  (this->EnvNAVXYTHETALATCfg).ActionsV = ppEVar12;
  puVar13 = (ulong *)operator_new__(uVar14);
  *puVar13 = uVar21;
  if (iVar16 != 0) {
    memset((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
           (puVar13 + 1),0,((uVar11 - 0x18) - (uVar11 - 0x18) % 0x18) + 0x18);
  }
  (this->EnvNAVXYTHETALATCfg).PredActionsV =
       (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
       (puVar13 + 1);
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168 = &(this->EnvNAVXYTHETALATCfg).FootprintPolygon;
  uVar22 = 0;
  local_148 = -1;
  local_140 = this;
  while ((long)uVar22 < (long)iVar16) {
    iVar16 = (this->EnvNAVXYTHETALATCfg).actionwidth;
    uVar21 = (ulong)iVar16;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar21;
    uVar11 = SUB168(auVar7 * ZEXT816(0x68),0);
    uVar14 = uVar11 + 8;
    if (0xfffffffffffffff7 < uVar11) {
      uVar14 = 0xffffffffffffffff;
    }
    if (SUB168(auVar7 * ZEXT816(0x68),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    puVar13 = (ulong *)operator_new__(uVar14);
    *puVar13 = uVar21;
    if (iVar16 != 0) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar13 + lVar17 + 0x48);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)puVar13 + lVar17 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)puVar13 + lVar17 + 0x58) = 0;
        puVar1 = (undefined8 *)((long)puVar13 + lVar17 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)puVar13 + lVar17 + 0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar17 = lVar17 + 0x68;
      } while (uVar21 * 0x68 - lVar17 != 0);
    }
    (this->EnvNAVXYTHETALATCfg).ActionsV[uVar22] = (EnvNAVXYTHETALATAction_t *)(puVar13 + 1);
    dVar2 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
              (this,uVar22 & 0xffffffff);
    local_160 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    dVar2 = dVar2 * 0.0 + dVar2 * 0.5;
    lVar17 = 0;
    local_170 = uVar22;
    for (lVar20 = 0; cVar10 = (char)uVar22, lVar20 != 0x138; lVar20 = lVar20 + 0x68) {
      pEVar15 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar22];
      (&pEVar15->aind)[lVar20] = (uchar)lVar17;
      (&pEVar15->starttheta)[lVar20] = cVar10;
      cVar10 = (char)(((int)local_148 + (int)lVar17) % (this->EnvNAVXYTHETALATCfg).NumThetaDirs);
      (&pEVar15->endtheta)[lVar20] = cVar10;
      local_138 = lVar17;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                (this,(ulong)(uint)(int)cVar10);
      dVar3 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      local_188 = cos((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      dVar8 = cos(dVar3);
      (&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar22]->dX)[lVar20] =
           (char)(int)(local_188 + *(double *)(&DAT_0014b6d0 + (ulong)(0.0 < dVar8) * 8));
      local_188 = sin(dVar3);
      dVar8 = sin(dVar3);
      dVar8 = local_188 + *(double *)(&DAT_0014b6d0 + (ulong)(0.0 < dVar8) * 8);
      ppEVar12 = (this->EnvNAVXYTHETALATCfg).ActionsV;
      pEVar15 = ppEVar12[uVar22];
      cVar19 = (char)(int)dVar8;
      (&pEVar15->dY)[lVar20] = cVar19;
      local_188 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
      uStack_180 = 0;
      cVar10 = (&pEVar15->dX)[lVar20];
      dVar9 = ceil(SQRT((double)((int)cVar19 * (int)cVar19 + (int)cVar10 * (int)cVar10)) *
                   ((local_188 * 1000.0) / (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs));
      this = local_140;
      *(int *)((long)&pEVar15->cost + lVar20) = (int)dVar9;
      local_158._8_4_ = (int)uStack_180;
      local_158._0_8_ = local_188 * 0.5;
      local_158._12_4_ = (int)((ulong)uStack_180 >> 0x20);
      lVar17 = *(long *)((long)&(pEVar15->intermptV).
                                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar20);
      if (*(long *)((long)&(pEVar15->intermptV).
                           super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + lVar20) != lVar17) {
        *(long *)((long)&(pEVar15->intermptV).
                         super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar20) = lVar17;
        pEVar15 = ppEVar12[uVar22];
      }
      lVar17 = *(long *)((long)&(pEVar15->intersectingcellsV).
                                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar20);
      if (*(long *)((long)&(pEVar15->intersectingcellsV).
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_finish + lVar20) != lVar17) {
        *(long *)((long)&(pEVar15->intersectingcellsV).
                         super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar20) = lVar17;
      }
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_48,local_168);
      uVar22 = local_170;
      dVar9 = (double)local_158._0_8_ + local_188 * (double)(int)cVar10;
      dVar8 = (double)local_158._0_8_ +
              local_188 * (double)(int)((long)((ulong)(ushort)((int)dVar8 << 8) << 0x30) >> 0x38);
      uVar23 = SUB84(dVar8,0);
      uVar24 = (undefined4)((ulong)dVar8 >> 0x20);
      local_b8._8_4_ = uVar23;
      local_b8._0_8_ = dVar9;
      local_b8._12_4_ = uVar24;
      pose.y._0_4_ = uVar23;
      pose.x = dVar9;
      pose.y._4_4_ = uVar24;
      pose.theta = dVar3;
      get_2d_footprint_cells
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_48,
                 (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                 ((long)&((this->EnvNAVXYTHETALATCfg).ActionsV[local_170]->intersectingcellsV).
                         super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20),pose,
                 (this->EnvNAVXYTHETALATCfg).cellsize_m);
      std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base(&local_48);
      local_c0 = local_160;
      local_d0 = dVar2;
      dStack_c8 = dVar2;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                (this,(long)&((this->EnvNAVXYTHETALATCfg).ActionsV[uVar22]->intersectingcellsV).
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar20);
      pEVar15 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar22];
      iVar16 = (int)(&pEVar15->endtheta)[lVar20];
      local_190 = (EnvNAVXYTHETALATAction_t *)(&pEVar15->aind + lVar20);
      std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
      emplace_back<EnvNAVXYTHETALATAction_t*>
                ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                 ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                 ((iVar16 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar16)),&local_190)
      ;
      lVar17 = local_138 + 1;
    }
    pEVar15 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar22];
    pEVar15[3].aind = '\x03';
    pEVar15[3].starttheta = cVar10;
    cVar10 = cVar10 + -1;
    pEVar15[3].endtheta = cVar10;
    if (cVar10 < '\0') {
      cVar10 = cVar10 + (char)(this->EnvNAVXYTHETALATCfg).NumThetaDirs;
      pEVar15[3].endtheta = cVar10;
    }
    pEVar15[3].dX = '\0';
    pEVar15[3].dY = '\0';
    pEVar15[3].cost = (int)((this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs * 1000.0);
    dVar3 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
    local_188 = dVar3 * 0.5;
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
              (this,(ulong)(uint)(int)cVar10);
    ppEVar12 = (this->EnvNAVXYTHETALATCfg).ActionsV;
    pEVar15 = ppEVar12[local_170];
    psVar4 = pEVar15[3].intermptV.
             super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pEVar15[3].intermptV.
        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
        super__Vector_impl_data._M_finish != psVar4) {
      pEVar15[3].intermptV.
      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar4;
      pEVar15 = ppEVar12[local_170];
    }
    psVar5 = pEVar15[3].intersectingcellsV.
             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pEVar15[3].intersectingcellsV.
        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
        super__Vector_impl_data._M_finish != psVar5) {
      pEVar15[3].intersectingcellsV.
      super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar5;
    }
    local_158._0_8_ = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_60,local_168);
    uVar22 = local_170;
    local_e8 = dVar3 * 0.0 + local_188;
    local_d8 = (double)local_158._0_8_;
    pose_00.y._0_4_ = SUB84(local_e8,0);
    pose_00.x = local_e8;
    pose_00.y._4_4_ = (int)((ulong)local_e8 >> 0x20);
    pose_00.theta = (double)local_158._0_8_;
    dStack_e0 = local_e8;
    get_2d_footprint_cells
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_60,
               &(this->EnvNAVXYTHETALATCfg).ActionsV[local_170][3].intersectingcellsV,pose_00,
               (this->EnvNAVXYTHETALATCfg).cellsize_m);
    std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base(&local_60);
    local_f0 = local_160;
    local_100 = dVar2;
    dStack_f8 = dVar2;
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
              (this,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar22][3].intersectingcellsV);
    uVar14 = local_170;
    local_190 = (this->EnvNAVXYTHETALATCfg).ActionsV[local_170];
    iVar16 = (int)local_190[3].endtheta;
    local_190 = local_190 + 3;
    std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
    emplace_back<EnvNAVXYTHETALATAction_t*>
              ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
               ((this->EnvNAVXYTHETALATCfg).PredActionsV +
               ((iVar16 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar16)),&local_190);
    pEVar15 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar14];
    pEVar15[4].aind = '\x04';
    pEVar15[4].starttheta = (char)uVar14;
    uVar22 = uVar14 + 1;
    cVar10 = (char)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
                   (long)(this->EnvNAVXYTHETALATCfg).NumThetaDirs);
    pEVar15[4].endtheta = cVar10;
    pEVar15[4].dX = '\0';
    pEVar15[4].dY = '\0';
    pEVar15[4].cost = (int)((this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs * 1000.0);
    dVar3 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
    local_188 = dVar3 * 0.5;
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
              (this,(ulong)(uint)(int)cVar10);
    local_158._4_4_ = extraout_XMM0_Db_02;
    local_158._0_4_ = extraout_XMM0_Da_02;
    ppEVar12 = (this->EnvNAVXYTHETALATCfg).ActionsV;
    pEVar15 = ppEVar12[uVar14];
    psVar4 = pEVar15[4].intermptV.
             super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pEVar15[4].intermptV.
        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
        super__Vector_impl_data._M_finish != psVar4) {
      pEVar15[4].intermptV.
      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar4;
      pEVar15 = ppEVar12[uVar14];
    }
    psVar5 = pEVar15[4].intersectingcellsV.
             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pEVar15[4].intersectingcellsV.
        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
        super__Vector_impl_data._M_finish != psVar5) {
      pEVar15[4].intersectingcellsV.
      super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar5;
    }
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_78,local_168);
    local_118 = dVar3 * 0.0 + local_188;
    local_108 = (double)local_158._0_8_;
    pose_01.y._0_4_ = SUB84(local_118,0);
    pose_01.x = local_118;
    pose_01.y._4_4_ = (int)((ulong)local_118 >> 0x20);
    pose_01.theta = (double)local_158._0_8_;
    dStack_110 = local_118;
    get_2d_footprint_cells
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_78,
               &(this->EnvNAVXYTHETALATCfg).ActionsV[uVar14][4].intersectingcellsV,pose_01,
               (this->EnvNAVXYTHETALATCfg).cellsize_m);
    std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base(&local_78);
    local_120 = local_160;
    local_130 = dVar2;
    dStack_128 = dVar2;
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
              (this,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar14][4].intersectingcellsV);
    local_190 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar14];
    iVar16 = (int)local_190[4].endtheta;
    local_190 = local_190 + 4;
    std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
    emplace_back<EnvNAVXYTHETALATAction_t*>
              ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
               ((this->EnvNAVXYTHETALATCfg).PredActionsV +
               ((iVar16 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar16)),&local_190);
    local_148 = local_148 + 1;
    iVar16 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  }
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4b])(this);
  std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base
            (&footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions()
{
    SBPL_PRINTF("Use of DeprecatedPrecomputeActions() is deprecated and probably doesn't work!\n");

    // construct list of actions
    SBPL_PRINTF("Pre-computing action data using the motion primitives for a 3D kinematic planning...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;
    // iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("processing angle %d\n", tind);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[EnvNAVXYTHETALATCfg.actionwidth];

        // compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.theta = DiscTheta2ContNew(tind);

        // the construction assumes that the robot first turns and then goes
        // along this new theta
        int aind = 0;
        for (; aind < 3; aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            // -1,0,1
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + aind - 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
            double angle = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = (int)(cos(angle) + 0.5 * (cos(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = (int)(sin(angle) + 0.5 * (sin(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM *
                    EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs *
                    sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));

            // compute intersecting cells
            sbpl_xy_theta_pt_t pose;
            pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.theta = angle;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            get_2d_footprint_cells(
                    EnvNAVXYTHETALATCfg.FootprintPolygon,
                    &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                    pose,
                    EnvNAVXYTHETALATCfg.cellsize_m);
            RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
            SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                        tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, angle,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

            // add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) {
                targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            }
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }

        // decrease and increase angle without movement
        aind = 3;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = tind - 1;
        if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta < 0) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta += EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        sbpl_xy_theta_pt_t pose;
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                    DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) {
            targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));

        aind = 4;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
    }

    // now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data\n");
}